

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

HighsInt create(HighsIndexCollection *index_collection,HighsInt from_col,HighsInt to_col,
               HighsInt dimension)

{
  HighsInt dimension_local;
  HighsInt to_col_local;
  HighsInt from_col_local;
  HighsIndexCollection *index_collection_local;
  HighsInt local_4;
  
  if (from_col < 0) {
    local_4 = 1;
  }
  else if (to_col < dimension) {
    index_collection->dimension_ = dimension;
    index_collection->is_interval_ = true;
    index_collection->from_ = from_col;
    index_collection->to_ = to_col;
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection, const HighsInt from_col,
                const HighsInt to_col, const HighsInt dimension) {
  if (from_col < 0) return kIndexCollectionCreateIllegalInterval;
  if (to_col >= dimension) return kIndexCollectionCreateIllegalInterval;
  index_collection.dimension_ = dimension;
  index_collection.is_interval_ = true;
  index_collection.from_ = from_col;
  index_collection.to_ = to_col;
  return kIndexCollectionCreateOk;
}